

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void backpressure_set_one(CManager_conflict cm,source_info *info)

{
  long lVar1;
  stone_type p_Var2;
  CManager_conflict cm_00;
  int iVar3;
  long in_RSI;
  long in_RDI;
  CMConnection unaff_retaddr;
  storage_proto_vals *store;
  proto_action *act;
  stone_type stone;
  stone_type to_stone;
  int s;
  action_state as;
  event_path_data evp;
  event_path_data in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  CManager_conflict cm_01;
  uchar type;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 0x118) + 0x40);
  if (*(int *)(lVar1 + 4) < 0) {
    __assert_fail("as->events_in_play >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                  ,0xb85,"void backpressure_set_one(CManager, struct source_info *)");
  }
  p_Var2 = stone_struct(in_stack_ffffffffffffffa8,0);
  cm_00 = (CManager_conflict)stone_struct(in_stack_ffffffffffffffa8,0);
  iVar3 = *(int *)(in_RSI + 0x10);
  if (iVar3 == 0) {
    cm_01 = (CManager_conflict)((_proto_action *)cm_00->reg_user_formats + *(int *)(in_RSI + 0x18));
    if (*(int *)(in_RSI + 0x1c) != 0) {
      if (p_Var2->is_stalled == 0) {
        printf("recurse unstall %d\n",(ulong)*(uint *)(in_RSI + 0x14));
        do_backpressure_unstall_callbacks(cm_01,(EVstone)((ulong)in_stack_ffffffffffffffb8 >> 0x20))
        ;
      }
      else {
        printf("recurse stall %d\n",(ulong)*(uint *)(in_RSI + 0x14));
        cm_00->CManager_ID = 1;
      }
      backpressure_transition
                (cm_01,(EVstone)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                 (stall_source)in_stack_ffffffffffffffb8,iVar3);
    }
    if (((*(action_value *)&cm_01->transports == Action_Store) &&
        (*(int *)&cm_01->field_0x1c != p_Var2->is_stalled)) &&
       (*(int *)&cm_01->field_0x1c = p_Var2->is_stalled, *(int *)&cm_01->control_list != 0)) {
      if (*(int *)&cm_01->field_0x1c == 0) {
        *(int *)(lVar1 + 4) = *(int *)(lVar1 + 4) + 1;
        *(int *)((long)&cm_00->control_list + 4) = *(int *)((long)&cm_00->control_list + 4) + 1;
        INT_CMadd_delayed_task
                  (cm_00,(int)((ulong)cm_01 >> 0x20),(int)cm_01,(CMPollFunc)&cm_01->CManager_ID,
                   (void *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
      }
      else {
        *(int *)(lVar1 + 4) = *(int *)(lVar1 + 4) + -1;
        *(int *)((long)&cm_00->control_list + 4) = *(int *)((long)&cm_00->control_list + 4) + -1;
      }
    }
  }
  else if (iVar3 == 1) {
    type = (uchar)((ulong)in_RDI >> 0x38);
    if (p_Var2->is_stalled == 0) {
      iVar3 = (cm_00->exchange_lock).__data.__owner + -1;
      (cm_00->exchange_lock).__data.__owner = iVar3;
      if (iVar3 == 0) {
        INT_CMwrite_evcontrol(unaff_retaddr,type,(int)in_RDI);
      }
    }
    else {
      iVar3 = (cm_00->exchange_lock).__data.__owner;
      (cm_00->exchange_lock).__data.__owner = iVar3 + 1;
      if (iVar3 == 0) {
        INT_CMwrite_evcontrol(unaff_retaddr,type,(int)in_RDI);
      }
    }
  }
  return;
}

Assistant:

static void
backpressure_set_one(CManager cm, struct source_info *info)
{
    event_path_data evp = cm->evp;
    action_state as = evp->as;
    assert(as->events_in_play >= 0);
    int s = info->to_stone;
    stone_type to_stone = stone_struct(evp,s);
    stone_type stone = stone_struct(evp, info->stone);
    switch (info->type) {
    case SOURCE_ACTION: {
            proto_action *act = &stone->proto_actions[info->u.action.action];
            
            if (info->u.action.would_recurse) {
                /* If we might be stalling the stone that has sources, we mark it as stalled before
                 * calling * backpressure_transition() because we are already recursing to its sources
                 * and performing actions as if the stone is stalled. If the stone unstalls
                 * as a result of the transition, we do want to do the recursive search
                 * since we do not recurse through stalled stones (though we do set would_recurse
                 * for them). 
                 */
                if (to_stone->is_stalled) {
                    printf("recurse stall %d\n", info->stone);
                    stone->is_stalled = 1;
                } else {
                    printf("recurse unstall %d\n", info->stone);
                    do_backpressure_unstall_callbacks(cm, info->stone);
                }
                /* TODO for, e.g., split stones check that we should actually unstall it 
                 * (maybe just count our upstream stall depth?) 
                 */
                backpressure_transition(cm, info->stone, Stall_Upstream, to_stone->is_stalled);
            }
            switch (act->action_type) {
            case Action_Store:
                {
                    struct storage_proto_vals *store = &act->o.store;
                    if (store->is_paused != to_stone->is_stalled) {
                        store->is_paused = to_stone->is_stalled;
                        if (store->is_sending) {
                            if (store->is_paused) {
                                --as->events_in_play;
                                --stone->pending_output;
                            } else {
                                ++as->events_in_play;
                                ++stone->pending_output;
                                (void) INT_CMadd_delayed_task(cm, 0, 0, deferred_process_actions, NULL);
                            }
                        }
                    }
                }
                break;
            default:;
                /* printf("unhandled action %d\n", act->action_type); */
                /* TODO more cases? */
            }
        }
        break;
    case SOURCE_REMOTE: {
            if (to_stone->is_stalled) {
                if (stone->squelch_depth++ == 0) {
                    INT_CMwrite_evcontrol(info->u.remote.conn, CONTROL_SQUELCH, info->stone);
                }
            } else if (0 == --stone->squelch_depth) {
                INT_CMwrite_evcontrol(info->u.remote.conn, CONTROL_UNSQUELCH, info->stone);
            }
        }
        break;
    default:
        /* XXX */
        ;
    }
}